

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvhz.cpp
# Opt level: O1

void UConverter_toUnicode_HZ_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  byte *pbVar2;
  long *plVar3;
  UChar *pUVar4;
  UConverter *pUVar5;
  byte *pbVar6;
  int8_t iVar7;
  uint uVar8;
  byte *pbVar9;
  byte *pbVar10;
  uint uVar11;
  int iVar12;
  UChar *pUVar13;
  uint uVar14;
  char tempBuf [2];
  ushort local_42;
  byte *local_40;
  UErrorCode *local_38;
  
  pbVar9 = (byte *)args->source;
  pUVar13 = args->target;
  pbVar2 = (byte *)args->sourceLimit;
  plVar3 = (long *)args->converter->extraInfo;
  local_38 = err;
joined_r0x002c092f:
  if (pbVar9 < pbVar2) {
    pUVar4 = args->targetLimit;
    iVar12 = (int)pbVar9 + -1;
    pbVar6 = pbVar9;
    do {
      pbVar10 = pbVar6;
      if (pUVar4 <= pUVar13) {
        *local_38 = U_BUFFER_OVERFLOW_ERROR;
        break;
      }
      bVar1 = *pbVar10;
      pUVar5 = args->converter;
      uVar11 = (uint)bVar1;
      if (pUVar5->mode == 0x7e) {
        pUVar5->mode = 0;
        if (0x7c < bVar1) {
          if (bVar1 == 0x7d) {
LAB_002c09c2:
            *(bool *)((long)plVar3 + 0x11) = bVar1 == 0x7b;
            if (*(char *)((long)plVar3 + 0x13) == '\0') {
              *(undefined1 *)((long)plVar3 + 0x13) = 1;
              goto LAB_002c09da;
            }
            *(undefined1 *)((long)plVar3 + 0x13) = 0;
            *local_38 = U_ILLEGAL_ESCAPE_SEQUENCE;
            pUVar5->toUCallbackReason = UCNV_IRREGULAR;
            pUVar5->toUBytes[0] = '~';
            args->converter->toUBytes[1] = bVar1;
            args->converter->toULength = '\x02';
            goto LAB_002c0b5e;
          }
          if (uVar11 != 0x7e) goto LAB_002c0b78;
          if (args->offsets != (int32_t *)0x0) {
            *(int *)((long)args->offsets + ((long)pUVar13 - (long)args->target) * 2) =
                 iVar12 - *(int *)&args->source;
          }
          pbVar9 = pbVar10 + 1;
          *pUVar13 = L'~';
          *(undefined1 *)((long)plVar3 + 0x13) = 0;
          goto LAB_002c0b09;
        }
        if (uVar11 == 10) goto LAB_002c09da;
        if (uVar11 == 0x7b) goto LAB_002c09c2;
LAB_002c0b78:
        *(undefined1 *)((long)plVar3 + 0x13) = 0;
        *local_38 = U_ILLEGAL_ESCAPE_SEQUENCE;
        pUVar5->toUBytes[0] = '~';
        if (*(char *)((long)plVar3 + 0x11) == '\0') {
          iVar7 = '\x01';
          if ((char)bVar1 < '\0') goto LAB_002c0b9b;
        }
        else {
          iVar7 = '\x01';
          if (0x5d < (byte)(bVar1 - 0x21)) {
LAB_002c0b9b:
            pbVar10 = pbVar10 + 1;
            args->converter->toUBytes[1] = bVar1;
            iVar7 = '\x02';
          }
        }
        args->converter->toULength = iVar7;
        pbVar9 = pbVar10;
        break;
      }
      if (*(char *)((long)plVar3 + 0x11) == '\0') {
        if (bVar1 != 0x7e) goto LAB_002c0a98;
      }
      else {
        uVar8 = pUVar5->toUnicodeStatus;
        if (uVar8 != 0) {
          uVar14 = uVar8 & 0xff;
          local_40 = pbVar10 + 1;
          if (((uVar8 + 0xdf & 0xff) < 0x5d) && ((byte)(bVar1 - 0x21) < 0x5e)) {
            local_42 = CONCAT11(bVar1,(char)uVar8 + -0x80) | 0x8000;
            uVar8 = ucnv_MBCSSimpleGetNextUChar_63
                              (*(UConverterSharedData **)(*plVar3 + 0x30),(char *)&local_42,2,
                               pUVar5->useFallback);
            uVar14 = uVar14 << 8 | uVar11;
            pbVar9 = local_40;
          }
          else {
            uVar8 = 0xffff;
            pbVar9 = pbVar10;
            if (0x5d < (byte)(bVar1 - 0x21)) {
              uVar14 = uVar14 * 0x100 + uVar11 + 0x10000;
              pbVar9 = local_40;
            }
          }
          args->converter->toUnicodeStatus = 0;
          uVar11 = uVar14;
          goto LAB_002c0ad7;
        }
        if (bVar1 != 0x7e) {
          pUVar5->toUnicodeStatus = uVar11 | 0x100;
          *(undefined1 *)((long)plVar3 + 0x13) = 0;
          goto LAB_002c09da;
        }
      }
      pUVar5->mode = 0x7e;
LAB_002c09da:
      iVar12 = iVar12 + 1;
      pbVar6 = pbVar10 + 1;
      if (pbVar2 <= pbVar10 + 1) {
LAB_002c0b5e:
        pbVar9 = pbVar10 + 1;
        break;
      }
    } while( true );
  }
  goto LAB_002c0b61;
LAB_002c0a98:
  pbVar9 = pbVar10 + 1;
  if ((char)bVar1 < '\0') {
    *(undefined1 *)((long)plVar3 + 0x13) = 0;
    uVar8 = 0xffff;
  }
  else {
    *(undefined1 *)((long)plVar3 + 0x13) = 0;
    uVar8 = uVar11;
  }
LAB_002c0ad7:
  if (0xfffd < (int)uVar8) {
    *local_38 = (uint)(uVar8 != 0xfffe) * 2 + U_INVALID_CHAR_FOUND;
    if (uVar11 < 0x100) {
      args->converter->toUBytes[0] = (uint8_t)uVar11;
      args->converter->toULength = '\x01';
    }
    else {
      args->converter->toUBytes[0] = (uint8_t)(uVar11 >> 8);
      args->converter->toUBytes[1] = (uint8_t)uVar11;
      args->converter->toULength = '\x02';
    }
LAB_002c0b61:
    args->target = pUVar13;
    args->source = (char *)pbVar9;
    return;
  }
  if (args->offsets != (int32_t *)0x0) {
    *(uint *)((long)args->offsets + ((long)pUVar13 - (long)args->target) * 2) =
         (~*(uint *)&args->source + (int)pbVar9) - (int)*(char *)((long)plVar3 + 0x11);
  }
  *pUVar13 = (UChar)uVar8;
LAB_002c0b09:
  pUVar13 = pUVar13 + 1;
  goto joined_r0x002c092f;
}

Assistant:

static void  U_CALLCONV
UConverter_toUnicode_HZ_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,
                                                            UErrorCode* err){
    char tempBuf[2];
    const char *mySource = ( char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    UChar32 targetUniChar = 0x0000;
    int32_t mySourceChar = 0x0000;
    UConverterDataHZ* myData=(UConverterDataHZ*)(args->converter->extraInfo);
    tempBuf[0]=0; 
    tempBuf[1]=0;

    /* Calling code already handles this situation. */
    /*if ((args->converter == NULL) || (args->targetLimit < args->target) || (mySourceLimit < args->source)){
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }*/
    
    while(mySource< mySourceLimit){
        
        if(myTarget < args->targetLimit){
            
            mySourceChar= (unsigned char) *mySource++;

            if(args->converter->mode == UCNV_TILDE) {
                /* second byte after ~ */
                args->converter->mode=0;
                switch(mySourceChar) {
                case 0x0A:
                    /* no output for ~\n (line-continuation marker) */
                    continue;
                case UCNV_TILDE:
                    if(args->offsets) {
                        args->offsets[myTarget - args->target]=(int32_t)(mySource - args->source - 2);
                    }
                    *(myTarget++)=(UChar)mySourceChar;
                    myData->isEmptySegment = FALSE;
                    continue;
                case UCNV_OPEN_BRACE:
                case UCNV_CLOSE_BRACE:
                    myData->isStateDBCS = (mySourceChar == UCNV_OPEN_BRACE);
                    if (myData->isEmptySegment) {
                        myData->isEmptySegment = FALSE; /* we are handling it, reset to avoid future spurious errors */
                        *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                        args->converter->toUCallbackReason = UCNV_IRREGULAR;
                        args->converter->toUBytes[0] = UCNV_TILDE;
                        args->converter->toUBytes[1] = static_cast<uint8_t>(mySourceChar);
                        args->converter->toULength = 2;
                        args->target = myTarget;
                        args->source = mySource;
                        return;
                    }
                    myData->isEmptySegment = TRUE;
                    continue;
                default:
                     /* if the first byte is equal to TILDE and the trail byte
                     * is not a valid byte then it is an error condition
                     */
                    /*
                     * Ticket 5691: consistent illegal sequences:
                     * - We include at least the first byte in the illegal sequence.
                     * - If any of the non-initial bytes could be the start of a character,
                     *   we stop the illegal sequence before the first one of those.
                     */
                    myData->isEmptySegment = FALSE; /* different error here, reset this to avoid spurious future error */
                    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                    args->converter->toUBytes[0] = UCNV_TILDE;
                    if( myData->isStateDBCS ?
                            (0x21 <= mySourceChar && mySourceChar <= 0x7e) :
                            mySourceChar <= 0x7f
                    ) {
                        /* The current byte could be the start of a character: Back it out. */
                        args->converter->toULength = 1;
                        --mySource;
                    } else {
                        /* Include the current byte in the illegal sequence. */
                        args->converter->toUBytes[1] = static_cast<uint8_t>(mySourceChar);
                        args->converter->toULength = 2;
                    }
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
            } else if(myData->isStateDBCS) {
                if(args->converter->toUnicodeStatus == 0x00){
                    /* lead byte */
                    if(mySourceChar == UCNV_TILDE) {
                        args->converter->mode = UCNV_TILDE;
                    } else {
                        /* add another bit to distinguish a 0 byte from not having seen a lead byte */
                        args->converter->toUnicodeStatus = (uint32_t) (mySourceChar | 0x100);
                        myData->isEmptySegment = FALSE; /* the segment has something, either valid or will produce a different error, so reset this */
                    }
                    continue;
                }
                else{
                    /* trail byte */
                    int leadIsOk, trailIsOk;
                    uint32_t leadByte = args->converter->toUnicodeStatus & 0xff;
                    targetUniChar = 0xffff;
                    /*
                     * Ticket 5691: consistent illegal sequences:
                     * - We include at least the first byte in the illegal sequence.
                     * - If any of the non-initial bytes could be the start of a character,
                     *   we stop the illegal sequence before the first one of those.
                     *
                     * In HZ DBCS, if the second byte is in the 21..7e range,
                     * we report only the first byte as the illegal sequence.
                     * Otherwise we convert or report the pair of bytes.
                     */
                    leadIsOk = (uint8_t)(leadByte - 0x21) <= (0x7d - 0x21);
                    trailIsOk = (uint8_t)(mySourceChar - 0x21) <= (0x7e - 0x21);
                    if (leadIsOk && trailIsOk) {
                        tempBuf[0] = (char) (leadByte+0x80) ;
                        tempBuf[1] = (char) (mySourceChar+0x80);
                        targetUniChar = ucnv_MBCSSimpleGetNextUChar(myData->gbConverter->sharedData,
                            tempBuf, 2, args->converter->useFallback);
                        mySourceChar= (leadByte << 8) | mySourceChar;
                    } else if (trailIsOk) {
                        /* report a single illegal byte and continue with the following DBCS starter byte */
                        --mySource;
                        mySourceChar = (int32_t)leadByte;
                    } else {
                        /* report a pair of illegal bytes if the second byte is not a DBCS starter */
                        /* add another bit so that the code below writes 2 bytes in case of error */
                        mySourceChar= 0x10000 | (leadByte << 8) | mySourceChar;
                    }
                    args->converter->toUnicodeStatus =0x00;
                }
            }
            else{
                if(mySourceChar == UCNV_TILDE) {
                    args->converter->mode = UCNV_TILDE;
                    continue;
                } else if(mySourceChar <= 0x7f) {
                    targetUniChar = (UChar)mySourceChar;  /* ASCII */
                    myData->isEmptySegment = FALSE; /* the segment has something valid */
                } else {
                    targetUniChar = 0xffff;
                    myData->isEmptySegment = FALSE; /* different error here, reset this to avoid spurious future error */
                }
            }
            if(targetUniChar < 0xfffe){
                if(args->offsets) {
                    args->offsets[myTarget - args->target]=(int32_t)(mySource - args->source - 1-(myData->isStateDBCS));
                }

                *(myTarget++)=(UChar)targetUniChar;
            }
            else /* targetUniChar>=0xfffe */ {
                if(targetUniChar == 0xfffe){
                    *err = U_INVALID_CHAR_FOUND;
                }
                else{
                    *err = U_ILLEGAL_CHAR_FOUND;
                }
                if(mySourceChar > 0xff){
                    args->converter->toUBytes[0] = (uint8_t)(mySourceChar >> 8);
                    args->converter->toUBytes[1] = (uint8_t)mySourceChar;
                    args->converter->toULength=2;
                }
                else{
                    args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                    args->converter->toULength=1;
                }
                break;
            }
        }
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    args->target = myTarget;
    args->source = mySource;
}